

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::ReleaseMessage
          (ExtensionSet *this,int number,MessageLite *prototype)

{
  Arena *pAVar1;
  anon_enum_32 *v1;
  anon_enum_32 *v2;
  LogMessage *pLVar2;
  CppType *v1_00;
  CppType *v2_00;
  undefined1 auVar3 [16];
  Arena *arena;
  MessageLite *ret;
  LogMessageFatal local_a0 [23];
  Voidify local_89;
  CppType local_88;
  CppType local_84;
  string *local_80;
  undefined1 local_68 [16];
  LogMessageFatal local_58 [23];
  Voidify local_41;
  anon_enum_32 local_40;
  anon_enum_32 local_3c;
  string *local_38;
  string *absl_log_internal_check_op_result;
  Extension *extension;
  MessageLite *prototype_local;
  ExtensionSet *pEStack_18;
  int number_local;
  ExtensionSet *this_local;
  
  extension = (Extension *)prototype;
  prototype_local._4_4_ = number;
  pEStack_18 = this;
  absl_log_internal_check_op_result = (string *)FindOrNull(this,number);
  if (absl_log_internal_check_op_result == (string *)0x0) {
    this_local = (ExtensionSet *)0x0;
  }
  else {
    local_3c = (anon_enum_32)((absl_log_internal_check_op_result->_M_string_length & 0x100) == 0);
    v1 = absl::lts_20240722::log_internal::
         GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_3c);
    local_40 = OPTIONAL_FIELD;
    v2 = absl::lts_20240722::log_internal::
         GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_40);
    local_38 = absl::lts_20240722::log_internal::
               Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                         (v1,v2,
                          "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                         );
    if (local_38 != (string *)0x0) {
      local_68 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
                 ,0x302,local_68._0_8_,local_68._8_8_);
      pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_58);
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_41,pLVar2);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_58);
    }
    local_84 = anon_unknown_58::cpp_type
                         ((FieldType)absl_log_internal_check_op_result->_M_string_length);
    v1_00 = absl::lts_20240722::log_internal::
            GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_84);
    local_88 = CPPTYPE_MESSAGE;
    v2_00 = absl::lts_20240722::log_internal::
            GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_88);
    local_80 = absl::lts_20240722::log_internal::
               Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                         (v1_00,v2_00,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
    if (local_80 != (string *)0x0) {
      auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_80);
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
                 ,0x302,auVar3._0_8_,auVar3._8_8_);
      pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_a0);
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_89,pLVar2);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_a0);
    }
    if ((*(byte *)((long)&absl_log_internal_check_op_result->_M_string_length + 2) >> 2 & 1) == 0) {
      if (this->arena_ == (Arena *)0x0) {
        arena = *(Arena **)absl_log_internal_check_op_result;
      }
      else {
        arena = (Arena *)MessageLite::New(*(MessageLite **)absl_log_internal_check_op_result);
        MessageLite::CheckTypeAndMergeFrom
                  ((MessageLite *)arena,*(MessageLite **)absl_log_internal_check_op_result);
      }
    }
    else {
      pAVar1 = this->arena_;
      arena = (Arena *)(**(code **)(**(long **)absl_log_internal_check_op_result + 0x40))
                                 (*(long **)absl_log_internal_check_op_result,extension,pAVar1);
      if ((pAVar1 == (Arena *)0x0) && (*(long **)absl_log_internal_check_op_result != (long *)0x0))
      {
        (**(code **)(**(long **)absl_log_internal_check_op_result + 8))();
      }
    }
    Erase(this,prototype_local._4_4_);
    this_local = (ExtensionSet *)arena;
  }
  return (MessageLite *)this_local;
}

Assistant:

MessageLite* ExtensionSet::ReleaseMessage(int number,
                                          const MessageLite& prototype) {
  Extension* extension = FindOrNull(number);
  if (extension == nullptr) {
    // Not present.  Return nullptr.
    return nullptr;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    MessageLite* ret = nullptr;
    if (extension->is_lazy) {
      Arena* const arena = arena_;
      ret = extension->ptr.lazymessage_value->ReleaseMessage(prototype, arena);
      if (arena == nullptr) {
        delete extension->ptr.lazymessage_value;
      }
    } else {
      if (arena_ == nullptr) {
        ret = extension->ptr.message_value;
      } else {
        // ReleaseMessage() always returns a heap-allocated message, and we are
        // on an arena, so we need to make a copy of this message to return.
        ret = extension->ptr.message_value->New();
        ret->CheckTypeAndMergeFrom(*extension->ptr.message_value);
      }
    }
    Erase(number);
    return ret;
  }
}